

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveUnusedBrs.cpp
# Opt level: O2

void __thiscall wasm::RemoveUnusedBrs::visitIf(RemoveUnusedBrs *this,If *curr)

{
  Break *this_00;
  ulong uVar1;
  Expression *condition;
  Expression *ifTrue;
  bool bVar2;
  Expression *pEVar3;
  Select *pSVar4;
  Const *ifFalse;
  PassRunner *pPVar5;
  CostAnalyzer local_190;
  Builder builder;
  
  if (curr->ifFalse != (Expression *)0x0) {
    return;
  }
  this_00 = (Break *)curr->ifTrue;
  if (((this_00->super_SpecificExpression<(wasm::Expression::Id)4>).super_Expression._id == BreakId)
     && (bVar2 = canTurnIfIntoBrIf(curr->condition,this_00->value,
                                   &((this->
                                     super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                                     ).super_Pass.runner)->options,
                                   (this->
                                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                                   ).
                                   super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                                   .
                                   super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                                   .currModule), bVar2)) {
    if (this_00->condition == (Expression *)0x0) {
      pSVar4 = (Select *)curr->condition;
    }
    else {
      if ((this_00->value != (Expression *)0x0) &&
         (uVar1 = (this_00->value->type).id, (6 < uVar1 & (byte)uVar1) != 0)) {
        return;
      }
      pEVar3 = LiteralUtils::makeZero
                         ((Type)0x2,
                          (this->
                          super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                          ).
                          super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          .
                          super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                          .currModule);
      bVar2 = tooCostlyToRunUnconditionally
                        (&((this->
                           super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                           ).super_Pass.runner)->options,this_00->condition,pEVar3);
      if (bVar2) {
        return;
      }
      EffectAnalyzer::EffectAnalyzer
                ((EffectAnalyzer *)&stack0xfffffffffffffe70,
                 &((this->
                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                   ).super_Pass.runner)->options,
                 (this->
                 super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                 ).
                 super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                 .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
                 currModule,this_00->condition);
      bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&stack0xfffffffffffffe70);
      EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe70);
      if (bVar2) {
        return;
      }
      _local_190 = (this->
                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                   ).
                   super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .currModule;
      pSVar4 = Builder::makeSelect((Builder *)&stack0xfffffffffffffe70,this_00->condition,
                                   curr->condition,pEVar3);
    }
    this_00->condition = (Expression *)pSVar4;
    Break::finalize(this_00);
    _local_190 = (this->
                 super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                 ).
                 super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                 .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
                 currModule;
    pEVar3 = Builder::dropIfConcretelyTyped
                       ((Builder *)&stack0xfffffffffffffe70,(Expression *)this_00);
    Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>::replaceCurrent
              (&(this->
                super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                ).
                super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>,
               pEVar3);
    this->anotherCycle = true;
  }
  pEVar3 = curr->ifTrue;
  if ((pEVar3->_id == IfId) && (*(long *)(pEVar3 + 2) == 0)) {
    pPVar5 = (this->
             super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
             ).super_Pass.runner;
    if ((pPVar5->options).shrinkLevel < 2) {
      CostAnalyzer::CostAnalyzer(&stack0xfffffffffffffe70,*(Expression **)(pEVar3 + 1));
      bVar2 = tooCostlyToRunUnconditionally(&pPVar5->options,local_190.cost);
      if (bVar2) {
        return;
      }
      pPVar5 = (this->
               super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
               ).super_Pass.runner;
    }
    EffectAnalyzer::EffectAnalyzer
              ((EffectAnalyzer *)&stack0xfffffffffffffe70,&pPVar5->options,
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
               ).
               super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
               super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>.
               currModule,*(Expression **)(pEVar3 + 1));
    bVar2 = EffectAnalyzer::hasSideEffects((EffectAnalyzer *)&stack0xfffffffffffffe70);
    EffectAnalyzer::~EffectAnalyzer((EffectAnalyzer *)&stack0xfffffffffffffe70);
    if (!bVar2) {
      _local_190 = (this->
                   super_WalkerPass<wasm::PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>_>
                   ).
                   super_PostWalker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .super_Walker<wasm::RemoveUnusedBrs,_wasm::Visitor<wasm::RemoveUnusedBrs,_void>_>
                   .currModule;
      condition = *(Expression **)(pEVar3 + 1);
      ifTrue = curr->condition;
      ifFalse = Builder::makeConst<int>((Builder *)&stack0xfffffffffffffe70,0);
      pSVar4 = Builder::makeSelect((Builder *)&stack0xfffffffffffffe70,condition,ifTrue,
                                   (Expression *)ifFalse);
      curr->condition = (Expression *)pSVar4;
      curr->ifTrue = (Expression *)pEVar3[1].type.id;
    }
  }
  return;
}

Assistant:

void visitIf(If* curr) {
    if (!curr->ifFalse) {
      // if without an else. try to reduce
      //    if (condition) br  =>  br_if (condition)
      if (Break* br = curr->ifTrue->dynCast<Break>()) {
        if (canTurnIfIntoBrIf(
              curr->condition, br->value, getPassOptions(), *getModule())) {
          if (!br->condition) {
            br->condition = curr->condition;
          } else {
            // In this case we can replace
            //   if (condition1) br_if (condition2)
            // =>
            //   br_if select (condition1) (condition2) (i32.const 0)
            // In other words, we replace an if (3 bytes) with a select and a
            // zero (also 3 bytes). The size is unchanged, but the select may
            // be further optimizable, and if select does not branch we also
            // avoid one branch.
            // Multivalue selects are not supported
            if (br->value && br->value->type.isTuple()) {
              return;
            }
            // If running the br's condition unconditionally is too expensive,
            // give up.
            auto* zero = LiteralUtils::makeZero(Type::i32, *getModule());
            if (tooCostlyToRunUnconditionally(
                  getPassOptions(), br->condition, zero)) {
              return;
            }
            // Of course we can't do this if the br's condition has side
            // effects, as we would then execute those unconditionally.
            if (EffectAnalyzer(getPassOptions(), *getModule(), br->condition)
                  .hasSideEffects()) {
              return;
            }
            Builder builder(*getModule());
            // Note that we use the br's condition as the select condition.
            // That keeps the order of the two conditions as it was originally.
            br->condition =
              builder.makeSelect(br->condition, curr->condition, zero);
          }
          br->finalize();
          replaceCurrent(Builder(*getModule()).dropIfConcretelyTyped(br));
          anotherCycle = true;
        }
      }

      // if (condition-A) { if (condition-B) .. }
      //   =>
      // if (condition-A ? condition-B : 0) { .. }
      //
      // This replaces an if, which is 3 bytes, with a select plus a zero, which
      // is also 3 bytes. The benefit is that the select may be faster, and also
      // further optimizations may be possible on the select.
      if (auto* child = curr->ifTrue->dynCast<If>()) {
        if (child->ifFalse) {
          return;
        }
        // If running the child's condition unconditionally is too expensive,
        // give up.
        if (tooCostlyToRunUnconditionally(getPassOptions(), child->condition)) {
          return;
        }
        // Of course we can't do this if the inner if's condition has side
        // effects, as we would then execute those unconditionally.
        if (EffectAnalyzer(getPassOptions(), *getModule(), child->condition)
              .hasSideEffects()) {
          return;
        }
        Builder builder(*getModule());
        curr->condition = builder.makeSelect(
          child->condition, curr->condition, builder.makeConst(int32_t(0)));
        curr->ifTrue = child->ifTrue;
      }
    }
    // TODO: if-else can be turned into a br_if as well, if one of the sides is
    //       a dead end we handle the case of a returned value to a local.set
    //       later down, see visitLocalSet.
  }